

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

natwm_error event_handle_motion_notify(natwm_state *state,xcb_motion_notify_event_t *event)

{
  xcb_rectangle_t *pxVar1;
  int iVar2;
  int iVar3;
  int32_t y;
  int32_t x;
  xcb_rectangle_t *monitor_rect;
  xcb_motion_notify_event_t *event_local;
  natwm_state *state_local;
  
  if (event->same_screen == '\0') {
    internal_logger(natwm_logger,LEVEL_ERROR,
                    "Receieved a motion event which did not occur on the root window");
    state_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else {
    pxVar1 = state->button_state->monitor_rect;
    iVar2 = (int)event->root_x - (int)pxVar1->x;
    iVar3 = (int)event->root_y - (int)pxVar1->y;
    if ((((iVar2 < 0) || (iVar3 < 0)) || ((int)(uint)pxVar1->width < iVar2)) ||
       ((int)(uint)pxVar1->height < iVar3)) {
      state_local._4_4_ = NO_ERROR;
    }
    else {
      state_local._4_4_ = button_handle_motion(state,event->state,event->event_x,event->event_y);
    }
  }
  return state_local._4_4_;
}

Assistant:

static enum natwm_error event_handle_motion_notify(struct natwm_state *state,
                                                   xcb_motion_notify_event_t *event)
{
        if (!event->same_screen) {
                LOG_ERROR(natwm_logger,
                          "Receieved a motion event which did not occur on the root window");

                return INVALID_INPUT_ERROR;
        }

        xcb_rectangle_t *monitor_rect = state->button_state->monitor_rect;
        int32_t x = event->root_x - monitor_rect->x;
        int32_t y = event->root_y - monitor_rect->y;

        if (x < 0 || y < 0 || x > monitor_rect->width || y > monitor_rect->height) {
                // We should only process motion events if they are within the current
                // monitor
                return NO_ERROR;
        }

        return button_handle_motion(state, event->state, event->event_x, event->event_y);
}